

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_ecdsa_signature_normalize
              (secp256k1_context *ctx,secp256k1_ecdsa_signature *sigout,
              secp256k1_ecdsa_signature *sigin)

{
  secp256k1_context *in_RDX;
  long in_RSI;
  long in_RDI;
  int ret;
  secp256k1_scalar s;
  secp256k1_scalar r;
  secp256k1_ecdsa_signature *in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffd0;
  secp256k1_scalar *in_stack_ffffffffffffffd8;
  int local_4;
  
  if (in_RDI != 0) {
    if (in_RDX == (secp256k1_context *)0x0) {
      secp256k1_callback_call
                ((secp256k1_callback *)(ulong)in_stack_ffffffffffffffd0,
                 (char *)in_stack_ffffffffffffffc8);
      local_4 = 0;
    }
    else {
      secp256k1_ecdsa_signature_load
                (in_RDX,in_stack_ffffffffffffffd8,
                 (secp256k1_scalar *)(ulong)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      local_4 = secp256k1_scalar_is_high((secp256k1_scalar *)&stack0xffffffffffffffd8);
      if (in_RSI != 0) {
        if (local_4 != 0) {
          secp256k1_scalar_negate
                    ((secp256k1_scalar *)&stack0xffffffffffffffd8,
                     (secp256k1_scalar *)&stack0xffffffffffffffd8);
        }
        secp256k1_ecdsa_signature_save
                  ((secp256k1_ecdsa_signature *)CONCAT44(local_4,in_stack_ffffffffffffffd0),
                   (secp256k1_scalar *)in_stack_ffffffffffffffc8,(secp256k1_scalar *)0x10342c);
      }
    }
    return local_4;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/secp256k1.c"
          ,0x1c2,"test condition failed: ctx != NULL");
  abort();
}

Assistant:

int secp256k1_ecdsa_signature_normalize(const secp256k1_context* ctx, secp256k1_ecdsa_signature *sigout, const secp256k1_ecdsa_signature *sigin) {
    secp256k1_scalar r, s;
    int ret = 0;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(sigin != NULL);

    secp256k1_ecdsa_signature_load(ctx, &r, &s, sigin);
    ret = secp256k1_scalar_is_high(&s);
    if (sigout != NULL) {
        if (ret) {
            secp256k1_scalar_negate(&s, &s);
        }
        secp256k1_ecdsa_signature_save(sigout, &r, &s);
    }

    return ret;
}